

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O0

Value * cmDumpCMakeInputs(Value *__return_storage_ptr__,cmake *cm)

{
  pointer *this;
  pointer *this_00;
  cmGlobalGenerator *gg_00;
  string *buildDir_00;
  string *sourceDir_00;
  Value *pVVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_01;
  Value local_268;
  Value local_240;
  Value local_218;
  Value local_1f0;
  Value local_1c8;
  Value local_1a0;
  Value local_178;
  Value local_150;
  Value local_128;
  Value local_100;
  Value local_d8;
  undefined1 local_b0 [8];
  Value tmp;
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmpFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explicitFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  internalFiles;
  string *sourceDir;
  string *buildDir;
  cmGlobalGenerator *gg;
  cmake *cm_local;
  Value *array;
  
  gg_00 = cmake::GetGlobalGenerator(cm);
  buildDir_00 = cmake::GetHomeOutputDirectory_abi_cxx11_(cm);
  sourceDir_00 = cmake::GetHomeDirectory_abi_cxx11_(cm);
  this = &explicitFiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  this_00 = &tmpFiles.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78);
  cmGetCMakeInputs(gg_00,sourceDir_00,buildDir_00,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)this_00,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_78);
  tmp.limit_._3_1_ = 0;
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  Json::Value::Value((Value *)local_b0,objectValue);
  Json::Value::Value(&local_d8,true);
  pVVar1 = Json::Value::operator[]((Value *)local_b0,&kIS_CMAKE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_d8);
  Json::Value::~Value(&local_d8);
  Json::Value::Value(&local_100,false);
  pVVar1 = Json::Value::operator[]((Value *)local_b0,&kIS_TEMPORARY_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_100);
  Json::Value::~Value(&local_100);
  (anonymous_namespace)::
  fromStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_128,
             (_anonymous_namespace_ *)
             &explicitFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,in);
  pVVar1 = Json::Value::operator[]((Value *)local_b0,&kSOURCES_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_128);
  Json::Value::~Value(&local_128);
  Json::Value::append(__return_storage_ptr__,(Value *)local_b0);
  Json::Value::Value(&local_150,objectValue);
  Json::Value::operator=((Value *)local_b0,&local_150);
  Json::Value::~Value(&local_150);
  Json::Value::Value(&local_178,false);
  pVVar1 = Json::Value::operator[]((Value *)local_b0,&kIS_CMAKE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_178);
  Json::Value::~Value(&local_178);
  Json::Value::Value(&local_1a0,false);
  pVVar1 = Json::Value::operator[]((Value *)local_b0,&kIS_TEMPORARY_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_1a0);
  Json::Value::~Value(&local_1a0);
  (anonymous_namespace)::
  fromStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_1c8,
             (_anonymous_namespace_ *)
             &tmpFiles.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,in_00);
  pVVar1 = Json::Value::operator[]((Value *)local_b0,&kSOURCES_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_1c8);
  Json::Value::~Value(&local_1c8);
  Json::Value::append(__return_storage_ptr__,(Value *)local_b0);
  Json::Value::Value(&local_1f0,objectValue);
  Json::Value::operator=((Value *)local_b0,&local_1f0);
  Json::Value::~Value(&local_1f0);
  Json::Value::Value(&local_218,false);
  pVVar1 = Json::Value::operator[]((Value *)local_b0,&kIS_CMAKE_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_218);
  Json::Value::~Value(&local_218);
  Json::Value::Value(&local_240,true);
  pVVar1 = Json::Value::operator[]((Value *)local_b0,&kIS_TEMPORARY_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_240);
  Json::Value::~Value(&local_240);
  (anonymous_namespace)::
  fromStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_268,(_anonymous_namespace_ *)local_78,in_01);
  pVVar1 = Json::Value::operator[]((Value *)local_b0,&kSOURCES_KEY_abi_cxx11_);
  Json::Value::operator=(pVVar1,&local_268);
  Json::Value::~Value(&local_268);
  Json::Value::append(__return_storage_ptr__,(Value *)local_b0);
  tmp.limit_._3_1_ = 1;
  Json::Value::~Value((Value *)local_b0);
  if ((tmp.limit_._3_1_ & 1) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tmpFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&explicitFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmDumpCMakeInputs(const cmake* cm)
{
  const cmGlobalGenerator* gg = cm->GetGlobalGenerator();
  const std::string& buildDir = cm->GetHomeOutputDirectory();
  const std::string& sourceDir = cm->GetHomeDirectory();

  std::vector<std::string> internalFiles;
  std::vector<std::string> explicitFiles;
  std::vector<std::string> tmpFiles;
  cmGetCMakeInputs(gg, sourceDir, buildDir, &internalFiles, &explicitFiles,
                   &tmpFiles);

  Json::Value array = Json::arrayValue;

  Json::Value tmp = Json::objectValue;
  tmp[kIS_CMAKE_KEY] = true;
  tmp[kIS_TEMPORARY_KEY] = false;
  tmp[kSOURCES_KEY] = fromStringList(internalFiles);
  array.append(tmp);

  tmp = Json::objectValue;
  tmp[kIS_CMAKE_KEY] = false;
  tmp[kIS_TEMPORARY_KEY] = false;
  tmp[kSOURCES_KEY] = fromStringList(explicitFiles);
  array.append(tmp);

  tmp = Json::objectValue;
  tmp[kIS_CMAKE_KEY] = false;
  tmp[kIS_TEMPORARY_KEY] = true;
  tmp[kSOURCES_KEY] = fromStringList(tmpFiles);
  array.append(tmp);

  return array;
}